

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nhr_response.c
# Opt level: O1

void nhr_response_check_is_finished(nhr_response r)

{
  nhr_bool nVar1;
  
  if ((r->transfer_encoding & 1) == 0) {
    if (r->content_length == 0) {
      nVar1 = '\0';
    }
    else {
      nVar1 = r->content_length == r->body_len;
    }
  }
  else {
    nVar1 = r->is_all_chunks_processed;
  }
  if (nVar1 != '\0') {
    if ((r->content_encoding & 3) != 0) {
      nhr_response_ungzip(r);
    }
    r->is_finished = '\x01';
  }
  return;
}

Assistant:

void nhr_response_check_is_finished(nhr_response r) {
	if (!nhr_response_is_finished_receiving(r)) {
		return;
	}

	if (r->content_encoding & NHR_CONTENT_ENCODING_GZIP ||
		r->content_encoding & NHR_CONTENT_ENCODING_DEFLATE) {
#if defined(NHR_GZIP)
		nhr_response_ungzip(r);
#endif
	}
	r->is_finished = nhr_true;
}